

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939_timedate_srv.c
# Opt level: O1

int main(int argc,char **argv)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  ulong uVar7;
  ulonglong uVar8;
  void *pvVar9;
  char *pcVar10;
  ulong uVar11;
  tm *ptVar12;
  tm *ptVar13;
  ssize_t sVar14;
  ulong extraout_RDX;
  bool bVar15;
  uint n;
  ulong uVar16;
  libj1939_cmn *cmn;
  long lVar17;
  sockaddr *__addr;
  int nfds;
  sockaddr_can peername;
  sockaddr_can addr;
  timespec ts;
  tm local_tm_buf;
  byte local_fc;
  char local_fb;
  char local_fa;
  char local_f9;
  char local_f8;
  char local_f7;
  char local_f6;
  char local_f5;
  int local_f4;
  ulong local_f0;
  libj1939_cmn *local_e8;
  time_t local_e0;
  sockaddr local_d8;
  undefined8 local_c8;
  undefined1 local_b8 [64];
  timespec local_78;
  tm local_68;
  
  piVar6 = (int *)malloc(0x68);
  if (piVar6 == (int *)0x0) {
    err(1,"can\'t allocate priv");
  }
  piVar6[0x14] = 0;
  piVar6[0x15] = 0;
  piVar6[0x16] = 0;
  piVar6[0x17] = 0;
  piVar6[0x10] = 0;
  piVar6[0x11] = 0;
  piVar6[0x12] = 0;
  piVar6[0x13] = 0;
  piVar6[0xc] = 0;
  piVar6[0xd] = 0;
  piVar6[0xe] = 0;
  piVar6[0xf] = 0;
  piVar6[8] = 0;
  piVar6[9] = 0;
  piVar6[10] = 0;
  piVar6[0xb] = 0;
  piVar6[4] = 0;
  piVar6[5] = 0;
  piVar6[6] = 0;
  piVar6[7] = 0;
  piVar6[0] = 0;
  piVar6[1] = 0;
  piVar6[2] = 0;
  piVar6[3] = 0;
  piVar6[0x18] = 0;
  piVar6[0x19] = 0;
  local_e8 = (libj1939_cmn *)(piVar6 + 2);
  libj1939_init_sockaddr_can((sockaddr_can *)local_e8,0xea00);
  local_b8._0_8_ = (ulong)(uint)local_b8._4_4_ << 0x20;
  local_f0 = 0;
  bVar3 = false;
  bVar15 = false;
  do {
    while (iVar4 = getopt_long(argc,argv,"a:n:i:",j1939_timedate_srv_parse_args_long_options,
                               local_b8), iVar4 != 0x69) {
      if (iVar4 == -1) {
        if (!bVar15) {
          main_cold_2();
          goto LAB_00102820;
        }
        bVar15 = true;
        iVar4 = 0;
        if (((local_f0 & 1) != 0) && (iVar4 = 0, bVar3)) {
          main_cold_3();
          iVar4 = -0x16;
          bVar15 = false;
        }
        goto LAB_0010282c;
      }
      if (iVar4 == 0x6e) {
        uVar8 = strtoull(_optarg,(char **)0x0,0x10);
        *(ulonglong *)(piVar6 + 4) = uVar8;
        bVar3 = true;
      }
      else {
        if (iVar4 != 0x61) {
          j1939_timedate_srv_print_help();
          goto LAB_00102820;
        }
        uVar7 = strtoul(_optarg,(char **)0x0,0x10);
        *(char *)(piVar6 + 7) = (char)uVar7;
        local_f0 = CONCAT71((int7)(uVar7 >> 8),1);
      }
    }
    uVar5 = if_nametoindex(_optarg);
    piVar6[3] = uVar5;
    bVar15 = true;
  } while (uVar5 != 0);
  main_cold_1();
LAB_00102820:
  bVar15 = false;
  iVar4 = -0x16;
LAB_0010282c:
  if (bVar15) {
    clock_gettime(1,&local_78);
    *(__time_t *)(piVar6 + 0x12) = local_78.tv_sec;
    *(long *)(piVar6 + 0x14) = local_78.tv_nsec;
    iVar4 = libj1939_create_epoll();
    if (-1 < iVar4) {
      piVar6[0xc] = iVar4;
      pvVar9 = calloc(10,0xc);
      *(void **)(piVar6 + 0xe) = pvVar9;
      if (pvVar9 == (void *)0x0) {
        iVar4 = -0xc;
      }
      else {
        piVar6[0x10] = 10;
        piVar6[0x11] = 0;
        local_b8._16_8_ = *(undefined8 *)((long)&local_e8->epoll_events + 8);
        local_b8._0_8_ = *(undefined8 *)local_e8;
        local_b8._8_8_ = ((anon_union_16_2_98a23d03_for_can_addr *)&local_e8->epoll_events)->tp;
        iVar4 = libj1939_open_socket();
        if (-1 < iVar4) {
          piVar6[1] = iVar4;
          iVar4 = libj1939_bind_socket(iVar4,(sockaddr_can *)local_b8);
          if (((-1 < iVar4) && (iVar4 = libj1939_socket_prio(piVar6[1],6), -1 < iVar4)) &&
             (iVar4 = libj1939_set_broadcast(piVar6[1]), -1 < iVar4)) {
            iVar4 = libj1939_add_socket_to_epoll(piVar6[0xc],piVar6[1],1);
          }
        }
      }
    }
    if (iVar4 == 0) {
      cmn = (libj1939_cmn *)(piVar6 + 0xc);
      local_e8 = cmn;
      do {
        iVar4 = libj1939_prepare_for_events(cmn,&local_f4,false);
        if (iVar4 == 0) {
          local_f0 = (ulong)local_f4;
          if (0 < (long)local_f0) {
            lVar17 = 4;
            uVar16 = 0;
            uVar7 = extraout_RDX;
            do {
              iVar4 = 0;
              if (*(ulong *)(piVar6 + 0x10) <= uVar16) break;
              uVar5 = *(uint *)(*(long *)(piVar6 + 0xe) + -4 + lVar17);
              if (uVar5 == 0) {
                pcVar10 = "no events";
                uVar11 = uVar7 & 0xffffffff;
                bVar3 = false;
LAB_00102b30:
                bVar15 = bVar3;
                uVar7 = uVar11;
                warn(pcVar10);
              }
              else {
                bVar15 = false;
                if ((uVar5 & 1) != 0) {
                  iVar2 = *(int *)(*(long *)(piVar6 + 0xe) + lVar17);
                  pcVar10 = (char *)malloc(0x38);
                  if (pcVar10 == (char *)0x0) {
                    main_cold_7();
                    uVar11 = 0xfffffff4;
                  }
                  else {
                    pcVar10[8] = '\b';
                    pcVar10[9] = '\0';
                    pcVar10[10] = '\0';
                    pcVar10[0xb] = '\0';
                    pcVar10[0xc] = '\0';
                    pcVar10[0xd] = '\0';
                    pcVar10[0xe] = '\0';
                    pcVar10[0xf] = '\0';
                    pcVar10[0x30] = '\x18';
                    pcVar10[0x31] = '\0';
                    pcVar10[0x32] = '\0';
                    pcVar10[0x33] = '\0';
                    *(int *)(pcVar10 + 0x34) = iVar2;
                    __addr = (sockaddr *)(pcVar10 + 0x18);
                    uVar11 = recvfrom(iVar2,pcVar10,8,0,__addr,(socklen_t *)(pcVar10 + 0x30));
                    uVar5 = (uint)uVar11;
                    if ((int)uVar5 < 0) {
                      main_cold_6();
                      uVar11 = local_b8._0_8_ & 0xffffffff;
                    }
                    else if ((int)uVar5 < 3) {
                      fprintf(_stderr,"received too short message: %i",uVar11 & 0xffffffff);
                      uVar11 = 0xffffffea;
                    }
                    else {
                      *(ulong *)(pcVar10 + 0x10) = (ulong)(uVar5 & 0x7fffffff);
                      if (*(int *)(pcVar10 + 0x28) == 0xea00) {
                        uVar5 = 0;
                        if (*pcVar10 != -0x1a) goto LAB_00102b0b;
                        if ((pcVar10[1] == -2) && (pcVar10[2] == '\0')) {
                          local_c8 = *(undefined8 *)(pcVar10 + 0x28);
                          local_d8.sa_family = __addr->sa_family;
                          local_d8.sa_data[0] = __addr->sa_data[0];
                          local_d8.sa_data[1] = __addr->sa_data[1];
                          local_d8.sa_data[2] = __addr->sa_data[2];
                          local_d8.sa_data[3] = __addr->sa_data[3];
                          local_d8.sa_data[4] = __addr->sa_data[4];
                          local_d8.sa_data[5] = __addr->sa_data[5];
                          local_d8.sa_data._6_8_ = *(undefined8 *)(pcVar10 + 0x20);
                          local_e0 = time((time_t *)0x0);
                          ptVar12 = gmtime_r(&local_e0,(tm *)local_b8);
                          ptVar13 = localtime_r(&local_e0,&local_68);
                          local_fa = (char)ptVar12->tm_hour;
                          local_f5 = (char)ptVar13->tm_hour - local_fa;
                          if (ptVar13->tm_mday != ptVar12->tm_mday) {
                            if (ptVar13->tm_hour < 0xc) {
                              local_f5 = local_f5 + '\x18';
                            }
                            else {
                              local_f5 = local_f5 + -0x18;
                            }
                          }
                          local_fc = (char)ptVar12->tm_sec << 2;
                          if (0xee < local_fc) {
                            local_fc = 0xef;
                          }
                          local_f6 = (char)ptVar12->tm_min;
                          local_fb = local_f6;
                          if (0x3b < (ptVar12->tm_min & 0xfcU)) {
                            local_fb = ';';
                          }
                          if (0x17 < (ptVar12->tm_hour & 0xf8U)) {
                            local_fa = '\x17';
                          }
                          local_f8 = (char)ptVar12->tm_mday * '\x04';
                          if (local_f8 < '\x02') {
                            local_f8 = '\x01';
                          }
                          bVar1 = (byte)ptVar12->tm_mon;
                          local_f9 = bVar1 + 1;
                          if (0xb < bVar1) {
                            local_f9 = '\x01';
                          }
                          iVar2 = ptVar12->tm_year;
                          local_f7 = '\0';
                          if ((0x54 < iVar2) && (local_f7 = -6, iVar2 < 0x150)) {
                            local_f7 = (char)iVar2 + -0x55;
                          }
                          local_f6 = (char)ptVar13->tm_min - local_f6;
                          local_c8 = CONCAT44(local_c8._4_4_,0xfee6);
                          sVar14 = sendto(piVar6[1],&local_fc,8,0,&local_d8,0x18);
                          uVar5 = 0;
                          if ((int)sVar14 == -1) {
                            main_cold_4();
                            uVar5 = local_b8._0_4_;
                          }
                        }
                      }
                      else {
                        fprintf(_stderr,"%s: unsupported PGN: %x","j1939_timedate_srv_rx_buf");
LAB_00102b0b:
                        uVar5 = 0;
                      }
                      uVar11 = 0;
                      if ((int)uVar5 < 0) {
                        main_cold_5();
                        uVar11 = (ulong)uVar5;
                      }
                    }
                  }
                  uVar7 = uVar7 & 0xffffffff;
                  bVar15 = false;
                  pcVar10 = "recv one";
                  bVar3 = true;
                  if ((int)uVar11 != 0) goto LAB_00102b30;
                }
              }
              if (bVar15) {
                iVar4 = (int)uVar7;
                break;
              }
              uVar16 = uVar16 + 1;
              lVar17 = lVar17 + 0xc;
            } while (local_f0 != uVar16);
            cmn = local_e8;
            if (iVar4 != 0) goto LAB_00102c93;
          }
          iVar4 = 0;
        }
LAB_00102c93:
      } while (iVar4 == 0);
      close(piVar6[0xc]);
      free(*(void **)(piVar6 + 0xe));
      close(piVar6[1]);
      close(*piVar6);
    }
  }
  return iVar4;
}

Assistant:

int main(int argc, char *argv[])
{
	struct j1939_timedate_srv_priv *priv;
	struct timespec ts;
	int ret;

	priv = malloc(sizeof(*priv));
	if (!priv)
		err(EXIT_FAILURE, "can't allocate priv");

	bzero(priv, sizeof(*priv));

	libj1939_init_sockaddr_can(&priv->sockname, J1939_PGN_REQUEST_PGN);

	ret = j1939_timedate_srv_parse_args(priv, argc, argv);
	if (ret)
		return ret;

	clock_gettime(CLOCK_MONOTONIC, &ts);
	priv->cmn.next_send_time = ts;

	ret = j1939_timedate_srv_sock_prepare(priv);
	if (ret)
		return ret;

	while (1) {
		ret = j1939_timedate_srv_process_events_and_tasks(priv);
		if (ret)
			break;
	}

	close(priv->cmn.epoll_fd);
	free(priv->cmn.epoll_events);

	close(priv->sock_main);
	close(priv->sock_nack);

	return ret;
}